

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidget::create(QWidget *this,WId window,bool initializeWindow,bool destroyOldWindow)

{
  QWidgetData *pQVar1;
  bool bVar2;
  WindowType WVar3;
  Int IVar4;
  int iVar5;
  QWidgetPrivate *d_00;
  QWidget *pQVar6;
  WId WVar7;
  QTLWExtra *pQVar8;
  long in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTLWExtra *topExtra;
  QWidget *parent;
  WindowFlags *flags;
  WindowType type;
  QWidgetPrivate *d;
  pointer in_stack_ffffffffffffff58;
  QWidgetPrivate *in_stack_ffffffffffffff60;
  WidgetAttribute attribute;
  QWidgetPrivate *in_stack_ffffffffffffff68;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  QWidgetPrivate *in_stack_ffffffffffffff80;
  QWidgetPrivate *in_stack_ffffffffffffff90;
  QWidgetPrivate *this_00;
  QFlagsStorageHelper<Qt::WindowType,_4> local_2c;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_00 = d_func((QWidget *)0x35ccd6);
  if (in_RSI != 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning
              (local_28,"QWidget::create(): Parameter \'window\' does not have any effect.");
  }
  bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,
                        (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  if ((((!bVar2) || (in_RSI != 0)) || (WVar7 = internalWinId((QWidget *)in_RDI), WVar7 == 0)) &&
     ((*(uint *)&(d_00->data).field_0x10 >> 0x12 & 1) == 0)) {
    WVar3 = windowType((QWidget *)in_stack_ffffffffffffff60);
    pQVar1 = *(QWidgetData **)&in_RDI->field_0x20;
    if (((WVar3 == Widget) || (WVar3 == SubWindow)) &&
       (pQVar6 = parentWidget((QWidget *)0x35cdb0), pQVar6 == (QWidget *)0x0)) {
      QFlags<Qt::WindowType>::operator|=(&pQVar1->window_flags,Window);
    }
    pQVar6 = parentWidget((QWidget *)0x35cdd7);
    if (pQVar6 != (QWidget *)0x0) {
      local_2c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           Qt::operator&((enum_type)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (enum_type)in_stack_ffffffffffffff60);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
      attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20);
      if (IVar4 == 0) {
        bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,attribute);
        if (((bVar2) && (WVar7 = internalWinId(pQVar6), WVar7 == 0)) &&
           (bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,
                                  (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20)),
           !bVar2)) {
          QWidgetPrivate::createWinId(in_stack_ffffffffffffff90);
          goto LAB_0035d196;
        }
      }
      else {
        bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,attribute);
        if (!bVar2) {
          createWinId((QWidget *)in_stack_ffffffffffffff60);
        }
      }
    }
    if ((create(unsigned_long_long,bool,bool)::paintOnScreenEnv == '\0') &&
       (iVar5 = __cxa_guard_acquire(&create(unsigned_long_long,bool,bool)::paintOnScreenEnv),
       iVar5 != 0)) {
      iVar5 = qEnvironmentVariableIntValue("QT_ONSCREEN_PAINT",(bool *)0x0);
      create::paintOnScreenEnv = 0 < iVar5;
      __cxa_guard_release(&create(unsigned_long_long,bool,bool)::paintOnScreenEnv);
    }
    if ((create::paintOnScreenEnv & 1U) != 0) {
      setAttribute((QWidget *)this_00,(WidgetAttribute)((ulong)in_RSI >> 0x20),
                   SUB81((ulong)in_RSI >> 0x18,0));
    }
    bVar2 = QCoreApplicationPrivate::testAttribute(3);
    if (bVar2) {
      setAttribute((QWidget *)this_00,(WidgetAttribute)((ulong)in_RSI >> 0x20),
                   SUB81((ulong)in_RSI >> 0x18,0));
    }
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if ((bVar2) &&
       ((pQVar8 = QWidgetPrivate::maybeTopData(in_stack_ffffffffffffff60),
        pQVar8 == (QTLWExtra *)0x0 || ((*(ushort *)&pQVar8->field_0xe0 >> 0xb & 1) == 0)))) {
      setAttribute_internal
                (WA_ContentsMarginsRespectsSafeArea,true,*(QWidgetData **)&in_RDI->field_0x20,d_00);
    }
    QWidgetPrivate::updateIsOpaque(in_stack_ffffffffffffff80);
    setAttribute((QWidget *)this_00,(WidgetAttribute)((ulong)in_RSI >> 0x20),
                 SUB81((ulong)in_RSI >> 0x18,0));
    QWidgetPrivate::create((QWidgetPrivate *)topExtra);
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if ((bVar2) && (WVar3 = windowType((QWidget *)in_stack_ffffffffffffff60), WVar3 != Desktop)) {
      QWidgetPrivate::topData(in_stack_ffffffffffffff60);
      operator_new(0xa8);
      QWidgetRepaintManager::QWidgetRepaintManager
                ((QWidgetRepaintManager *)in_stack_ffffffffffffff60,
                 (QWidget *)in_stack_ffffffffffffff58);
      std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::reset
                ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_> *)
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    QWidgetPrivate::setModal_sys(in_stack_ffffffffffffff60);
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if ((!bVar2) && (pQVar6 = parentWidget((QWidget *)0x35d001), pQVar6 != (QWidget *)0x0)) {
      parentWidget((QWidget *)0x35d011);
      bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,
                            (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      if (bVar2) {
        setAttribute((QWidget *)this_00,(WidgetAttribute)((ulong)in_RSI >> 0x20),
                     SUB81((ulong)in_RSI >> 0x18,0));
      }
    }
    bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,
                          (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (bVar2) {
      QWidgetPrivate::setWindowIcon_sys(in_stack_ffffffffffffff70);
    }
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if (bVar2) {
      QWidgetPrivate::topData(in_stack_ffffffffffffff60);
      bVar2 = QString::isEmpty((QString *)0x35d07d);
      if (!bVar2) {
        in_stack_ffffffffffffff70 = d_00;
        QWidgetPrivate::topData(in_stack_ffffffffffffff60);
        QWidgetPrivate::setWindowIconText_helper
                  (in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
      }
    }
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if (bVar2) {
      QWidgetPrivate::topData(in_stack_ffffffffffffff60);
      bVar2 = QString::isEmpty((QString *)0x35d0cc);
      if (!bVar2) {
        in_stack_ffffffffffffff68 = d_00;
        QWidgetPrivate::topData(in_stack_ffffffffffffff60);
        QWidgetPrivate::setWindowTitle_helper
                  (in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
      }
    }
    bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
    if (bVar2) {
      QWidgetPrivate::topData(in_stack_ffffffffffffff60);
      bVar2 = QString::isEmpty((QString *)0x35d11b);
      if (!bVar2) {
        in_stack_ffffffffffffff60 = d_00;
        QWidgetPrivate::topData(d_00);
        QWidgetPrivate::setWindowFilePath_helper
                  (in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
      }
    }
    WVar3 = windowType((QWidget *)in_stack_ffffffffffffff60);
    if (WVar3 != Desktop) {
      QWidgetPrivate::updateSystemBackground(d_00);
      bVar2 = isWindow((QWidget *)in_stack_ffffffffffffff60);
      if ((bVar2) &&
         (bVar2 = testAttribute((QWidget *)in_stack_ffffffffffffff68,
                                (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20)), !bVar2
         )) {
        QWidgetPrivate::setWindowIcon_sys(in_stack_ffffffffffffff70);
      }
    }
    QWidgetPrivate::updateFrameStrut(in_RDI);
  }
LAB_0035d196:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::create(WId window, bool initializeWindow, bool destroyOldWindow)
{
    Q_UNUSED(initializeWindow);
    Q_UNUSED(destroyOldWindow);

    Q_D(QWidget);
    if (Q_UNLIKELY(window))
        qWarning("QWidget::create(): Parameter 'window' does not have any effect.");
    if (testAttribute(Qt::WA_WState_Created) && window == 0 && internalWinId())
        return;

    if (d->data.in_destructor)
        return;

    Qt::WindowType type = windowType();
    Qt::WindowFlags &flags = data->window_flags;

    if ((type == Qt::Widget || type == Qt::SubWindow) && !parentWidget()) {
        type = Qt::Window;
        flags |= Qt::Window;
    }

    if (QWidget *parent = parentWidget()) {
        if (type & Qt::Window) {
            if (!parent->testAttribute(Qt::WA_WState_Created))
                parent->createWinId();
        } else if (testAttribute(Qt::WA_NativeWindow) && !parent->internalWinId()
                   && !testAttribute(Qt::WA_DontCreateNativeAncestors)) {
            // We're about to create a native child widget that doesn't have a native parent;
            // enforce a native handle for the parent unless the Qt::WA_DontCreateNativeAncestors
            // attribute is set.
            d->createWinId();
            // Nothing more to do.
            Q_ASSERT(testAttribute(Qt::WA_WState_Created));
            Q_ASSERT(internalWinId());
            return;
        }
    }


    static const bool paintOnScreenEnv = qEnvironmentVariableIntValue("QT_ONSCREEN_PAINT") > 0;
    if (paintOnScreenEnv)
        setAttribute(Qt::WA_PaintOnScreen);

    if (QApplicationPrivate::testAttribute(Qt::AA_NativeWindows))
        setAttribute(Qt::WA_NativeWindow);

    if (isWindow()) {
        // Make top levels automatically respect safe areas by default
        auto *topExtra = d->maybeTopData();
        if (!topExtra || !topExtra->explicitContentsMarginsRespectsSafeArea) {
            setAttribute_internal(Qt::WA_ContentsMarginsRespectsSafeArea,
                true, data, d);
        }
    }

    d->updateIsOpaque();

    setAttribute(Qt::WA_WState_Created);                        // set created flag
    d->create();

    // A real toplevel window needs a paint manager
    if (isWindow() && windowType() != Qt::Desktop)
        d->topData()->repaintManager.reset(new QWidgetRepaintManager(this));

    d->setModal_sys();

    if (!isWindow() && parentWidget() && parentWidget()->testAttribute(Qt::WA_DropSiteRegistered))
        setAttribute(Qt::WA_DropSiteRegistered, true);

    // need to force the resting of the icon after changing parents
    if (testAttribute(Qt::WA_SetWindowIcon))
        d->setWindowIcon_sys();

    if (isWindow() && !d->topData()->iconText.isEmpty())
        d->setWindowIconText_helper(d->topData()->iconText);
    if (isWindow() && !d->topData()->caption.isEmpty())
        d->setWindowTitle_helper(d->topData()->caption);
    if (isWindow() && !d->topData()->filePath.isEmpty())
        d->setWindowFilePath_helper(d->topData()->filePath);
    if (windowType() != Qt::Desktop) {
        d->updateSystemBackground();

        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon))
            d->setWindowIcon_sys();
    }

    // Frame strut update needed in cases where there are native widgets such as QGLWidget,
    // as those force native window creation on their ancestors before they are shown.
    // If the strut is not updated, any subsequent move of the top level window before show
    // will cause window frame to be ignored when positioning the window.
    // Note that this only helps on platforms that handle window creation synchronously.
    d->updateFrameStrut();
}